

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::doWalkModule(I64ToI32Lowering *this,Module *module)

{
  bool bVar1;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> _Var2;
  char *pcVar3;
  undefined8 uVar4;
  Builder *pBVar5;
  Const *pCVar6;
  Global *curr;
  long lVar7;
  __hashtable *p_Var8;
  char *extraout_RDX;
  __hashtable *p_Var9;
  pointer __old_p;
  Name n;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar10;
  Name NVar11;
  string_view sVar12;
  anon_union_16_6_1532cd5a_for_Literal_0 local_1e8;
  undefined8 local_1d8;
  size_t local_60;
  element_type *local_58;
  __hashtable *__h;
  Module *local_48;
  I64ToI32Lowering *local_40;
  _Head_base<0UL,_wasm::Global_*,_false> local_38;
  __single_object glob;
  
  pBVar5 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  if (pBVar5 == (Builder *)0x0) {
    pBVar5 = (Builder *)operator_new(8);
    pBVar5->wasm = module;
    (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
    super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = pBVar5;
  }
  lVar7 = (long)(module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    local_58 = (element_type *)&this->originallyI64Globals;
    p_Var8 = (__hashtable *)(lVar7 + (ulong)(lVar7 == 0));
    p_Var9 = (__hashtable *)0x0;
    __h = p_Var8;
    local_48 = module;
    local_40 = this;
    do {
      _Var2._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
           (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)p_Var9]._M_t.
           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
      if (*(long *)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) == 3) {
        local_1e8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_58;
        pVar10 = std::
                 _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                           ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)local_58,
                            _Var2._M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,&local_1e8);
        NVar11.super_IString.str._M_str = pVar10._8_8_;
        *(undefined8 *)
         ((long)_Var2._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = 2;
        NVar11.super_IString.str._M_len =
             *(size_t *)
              ((long)_Var2._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 8);
        NVar11 = makeHighName(*(wasm **)_Var2._M_t.
                                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                        .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,
                              NVar11);
        local_60 = NVar11.super_IString.str._M_len;
        pCVar6 = Builder::makeConst<int>
                           ((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0);
        bVar1 = *(bool *)((long)_Var2._M_t.
                                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48);
        local_38._M_head_impl = (Global *)operator_new(0x50);
        *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
        ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
        ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
        ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
        ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        ((local_38._M_head_impl)->type).id = 0;
        (local_38._M_head_impl)->init = (Expression *)0x0;
        *(undefined8 *)&(local_38._M_head_impl)->mutable_ = 0;
        ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
             local_60;
        ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
             NVar11.super_IString.str._M_str;
        ((local_38._M_head_impl)->type).id = 2;
        (local_38._M_head_impl)->init = (Expression *)pCVar6;
        (local_38._M_head_impl)->mutable_ = bVar1;
        if (*(long *)((long)_Var2._M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20) != 0)
        {
          Fatal::Fatal((Fatal *)&local_1e8.func);
          Fatal::operator<<((Fatal *)&local_1e8.func,(char (*) [27])"TODO: imported i64 globals");
          Fatal::~Fatal((Fatal *)&local_1e8.func);
        }
        pcVar3 = *(char **)((long)_Var2._M_t.
                                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                  .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40)
        ;
        if (*pcVar3 == '\n') {
          pBVar5 = (local_40->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          n.super_IString.str._M_str = extraout_RDX;
          n.super_IString.str._M_len = *(size_t *)(pcVar3 + 0x18);
          sVar12 = (string_view)makeHighName(*(wasm **)(pcVar3 + 0x10),n);
          pCVar6 = (Const *)MixedArena::allocSpace(&pBVar5->wasm->allocator,0x20,8);
          (pCVar6->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id =
               GlobalGetId;
          (pCVar6->value).field_0.func.super_IString.str = sVar12;
          (pCVar6->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 2;
          this = local_40;
        }
        else {
          if (*pcVar3 != '\x0e') {
            handle_unreachable("unexpected expression type",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                               ,0x8a);
          }
          if (*(long *)(pcVar3 + 0x20) != 3) {
            __assert_fail("type == Type::i64",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x129,"int64_t wasm::Literal::geti64() const");
          }
          uVar4 = *(undefined8 *)(pcVar3 + 0x10);
          local_1e8.i32 = (int)uVar4;
          local_1d8 = 2;
          Literal::operator=((Literal *)(pcVar3 + 0x10),(Literal *)&local_1e8.func);
          Literal::~Literal((Literal *)&local_1e8.func);
          this = local_40;
          pcVar3[8] = '\x02';
          pcVar3[9] = '\0';
          pcVar3[10] = '\0';
          pcVar3[0xb] = '\0';
          pcVar3[0xc] = '\0';
          pcVar3[0xd] = '\0';
          pcVar3[0xe] = '\0';
          pcVar3[0xf] = '\0';
          pCVar6 = Builder::makeConst<unsigned_int>
                             ((local_40->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                              (uint)((ulong)uVar4 >> 0x20));
        }
        module = local_48;
        (local_38._M_head_impl)->init = (Expression *)pCVar6;
        *(undefined8 *)
         (*(long *)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40) + 8) =
             2;
        Module::addGlobal(local_48,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                                   &local_38);
        p_Var8 = __h;
        if (local_38._M_head_impl != (Global *)0x0) {
          operator_delete(local_38._M_head_impl,0x50);
          p_Var8 = __h;
        }
      }
      p_Var9 = (__hashtable *)((long)&p_Var9->_M_buckets + 1);
    } while (p_Var8 != p_Var9);
    pBVar5 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  }
  curr = (Global *)operator_new(0x50);
  (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  (curr->type).id = 0;
  *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
  (curr->super_Importable).module.super_IString.str._M_len = 0;
  (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  (curr->super_Importable).base.super_IString.str._M_len = 0;
  curr->init = (Expression *)0x0;
  *(undefined8 *)&curr->mutable_ = 0;
  (curr->type).id = 2;
  pcVar3 = DAT_010b1008;
  (curr->super_Importable).super_Named.name.super_IString.str._M_len = INT64_TO_32_HIGH_BITS;
  (curr->super_Importable).super_Named.name.super_IString.str._M_str = pcVar3;
  pCVar6 = Builder::makeConst<int>(pBVar5,0);
  curr->init = (Expression *)pCVar6;
  curr->mutable_ = true;
  Module::addGlobal(module,curr);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             module);
  return;
}

Assistant:

void doWalkModule(Module* module) {
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    // add new globals for high bits
    for (size_t i = 0, globals = module->globals.size(); i < globals; ++i) {
      auto* curr = module->globals[i].get();
      if (curr->type != Type::i64) {
        continue;
      }
      originallyI64Globals.insert(curr->name);
      curr->type = Type::i32;
      auto high = builder->makeGlobal(makeHighName(curr->name),
                                      Type::i32,
                                      builder->makeConst(int32_t(0)),
                                      curr->mutable_ ? Builder::Mutable
                                                     : Builder::Immutable);
      if (curr->imported()) {
        Fatal() << "TODO: imported i64 globals";
      } else {
        if (auto* c = curr->init->dynCast<Const>()) {
          uint64_t value = c->value.geti64();
          c->value = Literal(uint32_t(value));
          c->type = Type::i32;
          high->init = builder->makeConst(uint32_t(value >> 32));
        } else if (auto* get = curr->init->dynCast<GlobalGet>()) {
          high->init =
            builder->makeGlobalGet(makeHighName(get->name), Type::i32);
        } else {
          WASM_UNREACHABLE("unexpected expression type");
        }
        curr->init->type = Type::i32;
      }
      module->addGlobal(std::move(high));
    }

    // For functions that return 64-bit values, we use this global variable
    // to return the high 32 bits.
    auto* highBits = new Global();
    highBits->type = Type::i32;
    highBits->name = INT64_TO_32_HIGH_BITS;
    highBits->init = builder->makeConst(int32_t(0));
    highBits->mutable_ = true;
    module->addGlobal(highBits);
    PostWalker<I64ToI32Lowering>::doWalkModule(module);
  }